

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  DeviceInterface *vk;
  VkDevice device;
  Resources res;
  Environment env;
  VkDescriptorSetAllocateInfo local_138;
  Move<vk::Handle<(vk::HandleType)22>_> local_110;
  Resources local_f0;
  Environment local_68;
  
  local_68.vkp = context->m_platformInterface;
  vk = Context::getDeviceInterface(context);
  local_68.vkd = vk;
  device = Context::getDevice(context);
  local_68.device = device;
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.programBinaries = context->m_progCollection;
  local_68.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_68.maxResourceConsumers = 1;
  DescriptorSet::Resources::Resources(&local_f0,&local_68,params);
  local_138.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_138.pNext = (void *)0x0;
  local_138.descriptorPool.m_internal =
       local_f0.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  local_138.descriptorSetCount = 1;
  local_138.pSetLayouts = (VkDescriptorSetLayout *)&local_f0.descriptorSetLayout.object;
  ::vk::allocateDescriptorSet(&local_110,vk,device,&local_138);
  if (local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    local_138._0_8_ =
         local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_110.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  local_138._0_8_ = &local_138.descriptorPool;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_138._0_8_,
             (long)local_138.pNext + local_138._0_8_);
  if ((VkDescriptorPool *)local_138._0_8_ != &local_138.descriptorPool) {
    operator_delete((void *)local_138._0_8_,local_138.descriptorPool.m_internal + 1);
  }
  DescriptorSet::Resources::~Resources(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}